

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__psd_decode_rle(stbi__context *s,stbi_uc *p,int pixelCount)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  uint uVar4;
  int local_30;
  stbi_uc val;
  int len;
  int nleft;
  int count;
  int pixelCount_local;
  stbi_uc *p_local;
  stbi__context *s_local;
  
  len = 0;
  _count = p;
  while( true ) {
    do {
      while( true ) {
        do {
          iVar3 = pixelCount - len;
          if (iVar3 < 1) {
            return 1;
          }
          bVar1 = stbi__get8(s);
          uVar4 = (uint)bVar1;
        } while (uVar4 == 0x80);
        if (0x7f < uVar4) break;
        local_30 = uVar4 + 1;
        if (iVar3 < local_30) {
          return 0;
        }
        len = local_30 + len;
        for (; local_30 != 0; local_30 = local_30 + -1) {
          sVar2 = stbi__get8(s);
          *_count = sVar2;
          _count = _count + 4;
        }
      }
    } while (uVar4 < 0x81);
    local_30 = 0x101 - uVar4;
    if (iVar3 < local_30) break;
    sVar2 = stbi__get8(s);
    len = local_30 + len;
    for (; local_30 != 0; local_30 = local_30 + -1) {
      *_count = sVar2;
      _count = _count + 4;
    }
  }
  return 0;
}

Assistant:

static int stbi__psd_decode_rle(stbi__context *s, stbi_uc *p, int pixelCount) {
  int count, nleft, len;

  count = 0;
  while ((nleft = pixelCount - count) > 0) {
    len = stbi__get8(s);
    if (len == 128) {
      // No-op.
    } else if (len < 128) {
      // Copy next len+1 bytes literally.
      len++;
      if (len > nleft)
        return 0; // corrupt data
      count += len;
      while (len) {
        *p = stbi__get8(s);
        p += 4;
        len--;
      }
    } else if (len > 128) {
      stbi_uc val;
      // Next -len+1 bytes in the dest are replicated from next source byte.
      // (Interpret len as a negative 8-bit int.)
      len = 257 - len;
      if (len > nleft)
        return 0; // corrupt data
      val = stbi__get8(s);
      count += len;
      while (len) {
        *p = val;
        p += 4;
        len--;
      }
    }
  }

  return 1;
}